

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

Status google::protobuf::json_internal::anon_unknown_5::
       ParseField<google::protobuf::json_internal::ParseProto2Descriptor>
                 (JsonLexer *lex,Desc<google::protobuf::json_internal::ParseProto2Descriptor> *desc,
                 string_view name,Msg<google::protobuf::json_internal::ParseProto2Descriptor> *msg)

{
  Field f;
  string_view field_name;
  string_view suffix;
  string_view text;
  string_view prefix;
  string_view text_00;
  undefined8 msg_00;
  JsonLexer *pJVar1;
  size_t sVar2;
  bool bVar3;
  Type type;
  size_type sVar4;
  Desc *pDVar5;
  ParseOptions *pPVar6;
  MessagePath *this;
  FieldDescriptor **ppFVar7;
  undefined8 in_R9;
  optional<const_google::protobuf::FieldDescriptor_*> oVar8;
  string_view name_00;
  string_view name_01;
  FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)524292> local_218;
  string local_208;
  undefined1 local_1e8 [16];
  string_view local_1d8;
  JsonLexer *local_1c8;
  char *pcStack_1c0;
  undefined1 local_1b8 [8];
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_json_internal_message_path_h:37:30)>
  pop;
  FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)524292> local_1a0;
  string local_190;
  undefined1 local_170 [16];
  JsonLexer *local_160;
  size_t local_158;
  _Storage<const_google::protobuf::FieldDescriptor_*,_true> local_150;
  undefined1 local_148;
  undefined7 uStack_147;
  FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)524292,_(absl::lts_20240722::FormatConversionCharSet)524292>
  local_128;
  string local_118;
  undefined1 local_f8 [16];
  size_t local_e8;
  size_t local_e0;
  string_view local_d8;
  undefined1 local_c8 [8];
  string_view correct_type_name;
  undefined7 uStack_9f;
  undefined1 local_98 [8];
  string_view extn_name;
  char *local_80;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  JsonLexer *local_58;
  char *local_50;
  _Storage<const_google::protobuf::FieldDescriptor_*,_true> local_48;
  optional<const_google::protobuf::FieldDescriptor_*> field;
  Msg<google::protobuf::json_internal::ParseProto2Descriptor> *msg_local;
  Desc<google::protobuf::json_internal::ParseProto2Descriptor> *desc_local;
  JsonLexer *lex_local;
  string_view name_local;
  
  lex_local = (JsonLexer *)name._M_str;
  pDVar5 = (Desc *)name._M_len;
  field.super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>._M_payload.
  super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>._8_8_ = in_R9;
  name_local._M_len = (size_t)msg;
  name_local._M_str = (char *)lex;
  std::optional<const_google::protobuf::FieldDescriptor_*>::optional
            ((optional<const_google::protobuf::FieldDescriptor_*> *)&local_48);
  local_58 = lex_local;
  local_50 = (char *)name_local._M_len;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,"[");
  text_00._M_str = local_50;
  text_00._M_len = (size_t)local_58;
  prefix._M_str = local_68._M_str;
  prefix._M_len = local_68._M_len;
  bVar3 = absl::lts_20240722::StartsWith(text_00,prefix);
  sVar2 = name_local._M_len;
  pJVar1 = lex_local;
  if (bVar3) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&extn_name._M_str,"]");
    text._M_str = (char *)sVar2;
    text._M_len = (size_t)pJVar1;
    suffix._M_str = local_80;
    suffix._M_len = (size_t)extn_name._M_str;
    bVar3 = absl::lts_20240722::EndsWith(text,suffix);
    local_68._M_str = local_80;
    if (bVar3) {
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&lex_local);
      _local_98 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                            ((basic_string_view<char,_std::char_traits<char>_> *)&lex_local,1,
                             sVar4 - 2);
      correct_type_name._M_str = (char *)local_98;
      name_00._M_str = local_80;
      name_00._M_len = extn_name._M_len;
      oVar8 = Proto2Descriptor::ExtensionByName((Proto2Descriptor *)pDVar5,(Desc *)local_98,name_00)
      ;
      local_48 = oVar8.super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>.
                 _M_payload.super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>.
                 _M_payload;
      field.super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>._M_payload._1_7_ =
           uStack_9f;
      field.super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>._M_payload._0_1_ =
           oVar8.super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>.
           _M_payload.super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>.
           _M_engaged;
      bVar3 = std::optional<const_google::protobuf::FieldDescriptor_*>::has_value
                        ((optional<const_google::protobuf::FieldDescriptor_*> *)&local_48);
      if (bVar3) {
        _local_c8 = Proto2Descriptor::TypeName(pDVar5);
        ppFVar7 = std::optional<const_google::protobuf::FieldDescriptor_*>::operator*
                            ((optional<const_google::protobuf::FieldDescriptor_*> *)&local_48);
        pDVar5 = Proto2Descriptor::ContainingType(*ppFVar7);
        local_d8 = Proto2Descriptor::TypeName(pDVar5);
        local_e8 = (size_t)local_c8;
        local_e0 = correct_type_name._M_len;
        bVar3 = std::operator!=(local_d8,_local_c8);
        if (bVar3) {
          absl::lts_20240722::str_format_internal::
          FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)524292,_(absl::lts_20240722::FormatConversionCharSet)524292>
          ::FormatSpecTemplate
                    (&local_128,
                     "\'%s\' is a known extension name, but is not an extension of \'%s\' as expected"
                    );
          absl::lts_20240722::
          StrFormat<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    (&local_118,&local_128,
                     (basic_string_view<char,_std::char_traits<char>_> *)local_98,
                     (basic_string_view<char,_std::char_traits<char>_> *)local_c8);
          local_f8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_118);
          JsonLocation::SourceLocation::current();
          JsonLexer::Invalid(lex,desc,local_f8._0_8_,local_f8._8_8_);
          std::__cxx11::string::~string((string *)&local_118);
          return (Status)(uintptr_t)lex;
        }
      }
      goto LAB_004b9228;
    }
  }
  local_160 = lex_local;
  local_158 = name_local._M_len;
  name_01._M_str = local_68._M_str;
  name_01._M_len = name_local._M_len;
  oVar8 = Proto2Descriptor::FieldByName((Proto2Descriptor *)pDVar5,(Desc *)lex_local,name_01);
  local_150 = oVar8.super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>.
              _M_payload.super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>.
              _M_payload;
  local_148 = oVar8.super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>.
              _M_payload.super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>.
              _M_engaged;
  field.super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>._M_payload.
  super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>._M_payload._1_7_ =
       uStack_147;
  field.super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>._M_payload.
  super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>._M_payload._0_1_ =
       local_148;
  local_48 = local_150;
LAB_004b9228:
  bVar3 = std::optional<const_google::protobuf::FieldDescriptor_*>::has_value
                    ((optional<const_google::protobuf::FieldDescriptor_*> *)&local_48);
  if (bVar3) {
    this = JsonLexer::path((JsonLexer *)desc);
    local_1c8 = lex_local;
    pcStack_1c0 = (char *)name_local._M_len;
    ppFVar7 = std::optional<const_google::protobuf::FieldDescriptor_*>::operator*
                        ((optional<const_google::protobuf::FieldDescriptor_*> *)&local_48);
    type = Proto2Descriptor::FieldType(*ppFVar7);
    ppFVar7 = std::optional<const_google::protobuf::FieldDescriptor_*>::operator*
                        ((optional<const_google::protobuf::FieldDescriptor_*> *)&local_48);
    local_1d8 = Proto2Descriptor::FieldTypeName(*ppFVar7);
    field_name._M_str = pcStack_1c0;
    field_name._M_len = (size_t)local_1c8;
    MessagePath::Push((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_json_internal_message_path_h:37:30)>
                       *)local_1b8,this,field_name,type,local_1d8);
    ppFVar7 = std::optional<const_google::protobuf::FieldDescriptor_*>::operator*
                        ((optional<const_google::protobuf::FieldDescriptor_*> *)&local_48);
    msg_00 = field.super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>.
             _M_payload.super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>.
             _8_8_;
    f = *ppFVar7;
    pPVar6 = JsonLexer::options((JsonLexer *)desc);
    bVar3 = ParseProto2Descriptor::HasParsed
                      (f,(Msg *)msg_00,(bool)(pPVar6->allow_legacy_syntax & 1));
    if ((!bVar3) || (bVar3 = JsonLexer::Peek((JsonLexer *)desc,kNull), bVar3)) {
      ppFVar7 = std::optional<const_google::protobuf::FieldDescriptor_*>::operator*
                          ((optional<const_google::protobuf::FieldDescriptor_*> *)&local_48);
      bVar3 = Proto2Descriptor::IsMap(*ppFVar7);
      if (bVar3) {
        ppFVar7 = std::optional<const_google::protobuf::FieldDescriptor_*>::operator*
                            ((optional<const_google::protobuf::FieldDescriptor_*> *)&local_48);
        ParseMap<google::protobuf::json_internal::ParseProto2Descriptor>
                  ((anon_unknown_5 *)lex,(JsonLexer *)desc,*ppFVar7,
                   (Msg<google::protobuf::json_internal::ParseProto2Descriptor> *)
                   field.super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>._8_8_);
      }
      else {
        ppFVar7 = std::optional<const_google::protobuf::FieldDescriptor_*>::operator*
                            ((optional<const_google::protobuf::FieldDescriptor_*> *)&local_48);
        bVar3 = Proto2Descriptor::IsRepeated(*ppFVar7);
        if (bVar3) {
          pPVar6 = JsonLexer::options((JsonLexer *)desc);
          if (((pPVar6->allow_legacy_syntax & 1U) == 0) ||
             (bVar3 = JsonLexer::Peek((JsonLexer *)desc,kArr), bVar3)) {
            ppFVar7 = std::optional<const_google::protobuf::FieldDescriptor_*>::operator*
                                ((optional<const_google::protobuf::FieldDescriptor_*> *)&local_48);
            ParseArray<google::protobuf::json_internal::ParseProto2Descriptor>
                      ((anon_unknown_5 *)lex,(JsonLexer *)desc,*ppFVar7,
                       (Msg<google::protobuf::json_internal::ParseProto2Descriptor> *)
                       field.
                       super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>.
                       _M_payload.
                       super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>._8_8_
                      );
          }
          else {
            ppFVar7 = std::optional<const_google::protobuf::FieldDescriptor_*>::operator*
                                ((optional<const_google::protobuf::FieldDescriptor_*> *)&local_48);
            ParseSingular<google::protobuf::json_internal::ParseProto2Descriptor>
                      (lex,(Field<google::protobuf::json_internal::ParseProto2Descriptor>)desc,
                       (Msg<google::protobuf::json_internal::ParseProto2Descriptor> *)*ppFVar7);
          }
        }
        else {
          ppFVar7 = std::optional<const_google::protobuf::FieldDescriptor_*>::operator*
                              ((optional<const_google::protobuf::FieldDescriptor_*> *)&local_48);
          ParseSingular<google::protobuf::json_internal::ParseProto2Descriptor>
                    (lex,(Field<google::protobuf::json_internal::ParseProto2Descriptor>)desc,
                     (Msg<google::protobuf::json_internal::ParseProto2Descriptor> *)*ppFVar7);
        }
      }
    }
    else {
      absl::lts_20240722::str_format_internal::
      FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)524292>::FormatSpecTemplate
                (&local_218,"\'%s\' has already been set (either directly or as part of a oneof)");
      absl::lts_20240722::StrFormat<std::basic_string_view<char,_std::char_traits<char>_>_>
                (&local_208,&local_218,
                 (basic_string_view<char,_std::char_traits<char>_> *)&lex_local);
      local_1e8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_208);
      JsonLocation::SourceLocation::current();
      JsonLexer::Invalid(lex,desc,local_1e8._0_8_,local_1e8._8_8_);
      std::__cxx11::string::~string((string *)&local_208);
    }
    absl::lts_20240722::
    Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/json/internal/message_path.h:37:30)>
    ::~Cleanup((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_json_internal_message_path_h:37:30)>
                *)local_1b8);
  }
  else {
    pPVar6 = JsonLexer::options((JsonLexer *)desc);
    if ((pPVar6->ignore_unknown_fields & 1U) == 0) {
      absl::lts_20240722::str_format_internal::
      FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)524292>::FormatSpecTemplate
                (&local_1a0,"no such field: \'%s\'");
      absl::lts_20240722::StrFormat<std::basic_string_view<char,_std::char_traits<char>_>_>
                (&local_190,&local_1a0,
                 (basic_string_view<char,_std::char_traits<char>_> *)&lex_local);
      local_170 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_190);
      JsonLocation::SourceLocation::current();
      JsonLexer::Invalid(lex,desc,local_170._0_8_,local_170._8_8_);
      std::__cxx11::string::~string((string *)&local_190);
    }
    else {
      JsonLexer::SkipValue(lex);
    }
  }
  return (Status)(uintptr_t)lex;
}

Assistant:

absl::Status ParseField(JsonLexer& lex, const Desc<Traits>& desc,
                        absl::string_view name, Msg<Traits>& msg) {
  absl::optional<Field<Traits>> field;
  if (absl::StartsWith(name, "[") && absl::EndsWith(name, "]")) {
    absl::string_view extn_name = name.substr(1, name.size() - 2);
    field = Traits::ExtensionByName(desc, extn_name);

    if (field.has_value()) {
      // The check for whether this is an invalid field occurs below, since it
      // is combined for both extension and non-extension fields.
      auto correct_type_name = Traits::TypeName(desc);
      if (Traits::TypeName(Traits::ContainingType(*field)) !=
          correct_type_name) {
        return lex.Invalid(absl::StrFormat(
            "'%s' is a known extension name, but is not an extension "
            "of '%s' as expected",
            extn_name, correct_type_name));
      }
    }
  } else {
    field = Traits::FieldByName(desc, name);
  }

  if (!field.has_value()) {
    if (!lex.options().ignore_unknown_fields) {
      return lex.Invalid(absl::StrFormat("no such field: '%s'", name));
    }
    return lex.SkipValue();
  }

  auto pop = lex.path().Push(name, Traits::FieldType(*field),
                             Traits::FieldTypeName(*field));

  if (Traits::HasParsed(
          *field, msg,
          /*allow_repeated_non_oneof=*/lex.options().allow_legacy_syntax) &&
      !lex.Peek(JsonLexer::kNull)) {
    return lex.Invalid(absl::StrFormat(
        "'%s' has already been set (either directly or as part of a oneof)",
        name));
  }

  if (Traits::IsMap(*field)) {
    return ParseMap<Traits>(lex, *field, msg);
  }

  if (Traits::IsRepeated(*field)) {
    if (lex.options().allow_legacy_syntax && !lex.Peek(JsonLexer::kArr)) {
      // The original ESF parser permits a single element in place of an array
      // thereof.
      return ParseSingular<Traits>(lex, *field, msg);
    }
    return ParseArray<Traits>(lex, *field, msg);
  }

  return ParseSingular<Traits>(lex, *field, msg);
}